

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_img_stats_float
              (float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngoodpix,
              float *minvalue,float *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  float fVar1;
  size_t sVar2;
  long ii;
  long lVar3;
  void *__ptr;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float *value;
  long ngood;
  size_t local_78;
  long *local_70;
  int local_64;
  float maxval;
  float minval;
  double *local_58;
  long local_50;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    lVar3 = ny * nx;
    if (nullcheck == 0) {
      if (lVar3 < 1) goto LAB_001fab6e;
      dVar14 = 0.0;
      lVar12 = 0;
      dVar16 = 0.0;
      do {
        dVar15 = (double)array[lVar12];
        dVar16 = dVar16 + dVar15;
        dVar14 = dVar14 + dVar15 * dVar15;
        lVar12 = lVar12 + 1;
        ngood = lVar3;
      } while (lVar3 - lVar12 != 0);
    }
    else if (lVar3 < 1) {
      lVar3 = 0;
LAB_001fab6e:
      dVar16 = 0.0;
      dVar14 = 0.0;
      ngood = lVar3;
    }
    else {
      dVar14 = 0.0;
      ngood = 0;
      dVar16 = 0.0;
      lVar12 = 0;
      do {
        fVar1 = array[lVar12];
        if ((fVar1 != nullvalue) || (NAN(fVar1) || NAN(nullvalue))) {
          ngood = ngood + 1;
          dVar15 = (double)fVar1;
          dVar16 = dVar16 + dVar15;
          dVar14 = dVar14 + dVar15 * dVar15;
        }
        lVar12 = lVar12 + 1;
      } while (lVar3 - lVar12 != 0);
    }
    if (ngood < 2) {
      if (ngood != 1) {
        dVar16 = 0.0;
      }
      ngood = (long)(ngood == 1);
      dVar14 = 0.0;
    }
    else {
      dVar16 = dVar16 / (double)ngood;
      dVar14 = dVar14 / (double)ngood - dVar16 * dVar16;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (mean != (double *)0x0) {
      *mean = dVar16;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar14;
    }
  }
  if (noise1 == (double *)0x0) goto LAB_001fb062;
  dVar14 = 0.0;
  if (2 < nx) {
    local_70 = ngoodpix;
    __ptr = calloc(nx,4);
    if (__ptr == (void *)0x0) {
      *status = 0x71;
    }
    else {
      pdVar4 = (double *)calloc(ny,8);
      if (pdVar4 != (double *)0x0) {
        local_58 = pdVar4;
        if (ny < 1) {
          local_78 = 0;
        }
        else {
          lVar3 = nx * 4;
          local_78 = 0;
          lVar12 = 0;
          pfVar13 = array;
          local_64 = nullcheck;
          local_50 = lVar3;
          do {
            lVar7 = 0;
            lVar5 = lVar7;
            if (nullcheck != 0) {
              do {
                lVar5 = lVar7;
                if ((pfVar13[lVar7] != nullvalue) || (NAN(pfVar13[lVar7]) || NAN(nullvalue))) break;
                lVar7 = lVar7 + 1;
                lVar5 = nx;
              } while (nx != lVar7);
            }
            if (lVar5 != nx) {
              lVar3 = lVar5 + 1;
              if (lVar3 < nx) {
                pfVar8 = array + lVar12 * nx + lVar5;
                uVar9 = 0;
                do {
                  lVar5 = lVar3;
                  if ((nullcheck != 0) && (lVar3 < nx)) {
                    while (lVar5 = lVar3, pfVar13[lVar3] == nullvalue) {
                      if ((NAN(pfVar13[lVar3]) || NAN(nullvalue)) ||
                         (lVar3 = lVar3 + 1, lVar5 = nx, nx == lVar3)) break;
                    }
                  }
                  if (lVar5 == nx) break;
                  fVar1 = *pfVar8;
                  pfVar8 = array + lVar12 * nx + lVar5;
                  *(float *)((long)__ptr + uVar9 * 4) = fVar1 - *pfVar8;
                  uVar9 = uVar9 + 1;
                  lVar3 = lVar5 + 1;
                } while (lVar3 < nx);
              }
              else {
                uVar9 = 0;
              }
              lVar3 = local_50;
              if (1 < uVar9) {
                dVar14 = 0.0;
                dVar16 = 0.0;
                uVar6 = 0;
                do {
                  dVar15 = (double)*(float *)((long)__ptr + uVar6 * 4);
                  dVar16 = dVar16 + dVar15;
                  dVar14 = dVar14 + dVar15 * dVar15;
                  uVar6 = uVar6 + 1;
                } while (uVar9 != uVar6);
                dVar16 = dVar16 / (double)(long)uVar9;
                dVar14 = dVar14 / (double)(long)uVar9 - dVar16 * dVar16;
                if (dVar14 < 0.0) {
                  dVar14 = sqrt(dVar14);
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                if (0.0 < dVar14) {
                  iVar11 = 0;
                  do {
                    if ((long)uVar9 < 1) {
                      uVar10 = 0;
                    }
                    else {
                      uVar6 = 0;
                      uVar10 = 0;
                      do {
                        fVar1 = *(float *)((long)__ptr + uVar6 * 4);
                        if (ABS((double)fVar1 - dVar16) < dVar14 * 5.0) {
                          if ((long)uVar10 < (long)uVar6) {
                            *(float *)((long)__ptr + uVar10 * 4) = fVar1;
                          }
                          uVar10 = uVar10 + 1;
                        }
                        uVar6 = uVar6 + 1;
                      } while (uVar9 != uVar6);
                    }
                    if (uVar10 == uVar9) break;
                    if ((long)uVar10 < 1) {
                      dVar16 = 0.0;
                      dVar14 = 0.0;
                    }
                    else {
                      dVar14 = 0.0;
                      dVar16 = 0.0;
                      uVar9 = 0;
                      do {
                        dVar15 = (double)*(float *)((long)__ptr + uVar9 * 4);
                        dVar16 = dVar16 + dVar15;
                        dVar14 = dVar14 + dVar15 * dVar15;
                        uVar9 = uVar9 + 1;
                      } while (uVar10 != uVar9);
                    }
                    if ((long)uVar10 < 2) {
                      dVar14 = 0.0;
                      if (uVar10 != 1) {
                        dVar16 = 0.0;
                      }
                    }
                    else {
                      dVar16 = dVar16 / (double)(long)uVar10;
                      dVar14 = dVar14 / (double)(long)uVar10 - dVar16 * dVar16;
                      if (dVar14 < 0.0) {
                        dVar14 = sqrt(dVar14);
                      }
                      else {
                        dVar14 = SQRT(dVar14);
                      }
                    }
                    iVar11 = iVar11 + 1;
                    uVar9 = uVar10;
                  } while (iVar11 != 3);
                }
                local_58[local_78] = dVar14;
                local_78 = local_78 + 1;
                lVar3 = local_50;
                nullcheck = local_64;
              }
            }
            lVar12 = lVar12 + 1;
            pfVar13 = (float *)((long)pfVar13 + lVar3);
          } while (lVar12 != ny);
        }
        pdVar4 = local_58;
        sVar2 = local_78;
        if (local_78 == 0) {
          dVar14 = 0.0;
        }
        else if (local_78 == 1) {
          dVar14 = *local_58;
        }
        else {
          qsort(local_58,local_78,8,FnCompare_double);
          dVar14 = (*(double *)
                     ((long)pdVar4 +
                     ((sVar2 - ((long)(sVar2 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                   *(double *)
                    ((long)pdVar4 + (sVar2 - ((long)sVar2 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5
          ;
        }
        dVar14 = dVar14 * 0.70710678;
        free(pdVar4);
        free(__ptr);
        ngoodpix = local_70;
        goto LAB_001fb05d;
      }
      free(__ptr);
      *status = 0x71;
    }
    dVar14 = 0.0;
    ngoodpix = local_70;
  }
LAB_001fb05d:
  *noise1 = dVar14;
LAB_001fb062:
  if ((minvalue != (float *)0x0 || maxvalue != (float *)0x0) || noise3 != (double *)0x0) {
    FnNoise5_float(array,nx,ny,nullcheck,nullvalue,&ngood,&minval,&maxval,&xnoise2,&xnoise3,&xnoise5
                   ,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (minvalue != (float *)0x0) {
      *minvalue = minval;
    }
    if (maxvalue != (float *)0x0) {
      *maxvalue = maxval;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise2;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise3;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = xnoise5;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_float(float *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	float *minvalue,    /* returned minimum non-null value in the array */
	float *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input float image.
*/
{
	long ngood;
	float minval, maxval;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_float(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_float(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_float(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}